

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall imrt::Collimator::insertYorder(Collimator *this,double y)

{
  double dVar1;
  iterator __position;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  ulong uVar3;
  const_iterator __position_00;
  long lVar4;
  double local_18;
  
  local_18 = y;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                    ((this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position_00._M_current =
       (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  __position._M_current =
       (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar4 = (long)__position._M_current - (long)__position_00._M_current;
  if (lVar4 == 0 || _Var2._M_current != __position._M_current) {
    if (_Var2._M_current != __position._M_current) {
      return;
    }
  }
  else {
    uVar3 = 1;
    do {
      dVar1 = *__position_00._M_current;
      if (local_18 < dVar1) {
        std::vector<double,_std::allocator<double>_>::insert(&this->ycoord,__position_00,&local_18);
        return;
      }
      if ((ulong)(lVar4 >> 3) <= uVar3) break;
      __position_00._M_current = __position_00._M_current + 1;
      uVar3 = uVar3 + 1;
    } while (dVar1 <= local_18);
  }
  if (__position._M_current ==
      (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->ycoord,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void Collimator::insertYorder(double y) {
    bool flag=false;
    if (find(ycoord.begin(), ycoord.end(), y) != ycoord.end())
      flag=true;
    for (int j=0; j< ycoord.size() && !flag; j++) {
      if (ycoord[j] > y) {
        ycoord.insert(ycoord.begin()+j, y);
        flag=true;
      }
    }
    if (!flag) ycoord.push_back(y);
  }